

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::format_uint<4u,char,unsigned_long>
                 (char *buffer,unsigned_long value,int num_digits,bool upper)

{
  bool bVar1;
  undefined7 in_register_00000009;
  char *pcVar2;
  char *pcVar3;
  
  if ((int)CONCAT71(in_register_00000009,upper) == 0) {
    pcVar2 = "0123456789abcdef";
  }
  else {
    pcVar2 = "0123456789ABCDEF";
  }
  pcVar3 = buffer + num_digits;
  do {
    pcVar3 = pcVar3 + -1;
    *pcVar3 = pcVar2[(uint)value & 0xf];
    bVar1 = 0xf < value;
    value = value >> 4;
  } while (bVar1);
  return buffer + num_digits;
}

Assistant:

inline Char* format_uint(Char* buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : data::hex_digits;
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}